

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  char cVar1;
  ulong uVar2;
  iterator iVar3;
  bool bVar4;
  cmConditionEvaluator *pcVar5;
  char *pcVar6;
  cmState *this_00;
  cmCommand *pcVar7;
  string *psVar8;
  cmTarget *pcVar9;
  ostream *poVar10;
  cmTest *pcVar11;
  PolicyID id;
  cmMakefile *pcVar12;
  cmConditionEvaluator *this_01;
  _Self __tmp;
  cmExpandedCommandArgument *pcVar13;
  int reducible;
  iterator local_1e0;
  iterator arg;
  iterator local_1d0;
  string local_1c8;
  PolicyID pid;
  
  do {
    reducible = 0;
    arg._M_node = (newArgs->
                  super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
    while( true ) {
      this_01 = (cmConditionEvaluator *)&pid;
      if (arg._M_node == (_List_node_base *)newArgs) break;
      local_1e0._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(arg._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_1d0._M_node = local_1e0._M_node;
      if (local_1e0._M_node != (_List_node_base *)newArgs) {
        local_1d0._M_node = (local_1e0._M_node)->_M_next;
      }
      pcVar13 = (cmExpandedCommandArgument *)(arg._M_node + 1);
      bVar4 = IsKeyword(this,&keyEXISTS_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar5 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
        bVar4 = cmsys::SystemTools::FileExists((char *)pcVar5);
        HandlePredicate(pcVar5,bVar4,&reducible,&arg,newArgs,&local_1e0,&local_1d0);
      }
      bVar4 = IsKeyword(this,&keyIS_DIRECTORY_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
        std::__cxx11::string::string((string *)this_01,pcVar6,(allocator *)&local_1c8);
        pcVar5 = this_01;
        bVar4 = cmsys::SystemTools::FileIsDirectory((string *)this_01);
        HandlePredicate(pcVar5,bVar4,&reducible,&arg,newArgs,&local_1e0,&local_1d0);
        std::__cxx11::string::~string((string *)this_01);
      }
      bVar4 = IsKeyword(this,&keyIS_SYMLINK_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
        std::__cxx11::string::string((string *)this_01,pcVar6,(allocator *)&local_1c8);
        pcVar5 = this_01;
        bVar4 = cmsys::SystemTools::FileIsSymlink((string *)this_01);
        HandlePredicate(pcVar5,bVar4,&reducible,&arg,newArgs,&local_1e0,&local_1d0);
        std::__cxx11::string::~string((string *)this_01);
      }
      bVar4 = IsKeyword(this,&keyIS_ABSOLUTE_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar5 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
        bVar4 = cmsys::SystemTools::FileIsFullPath((char *)pcVar5);
        HandlePredicate(pcVar5,bVar4,&reducible,&arg,newArgs,&local_1e0,&local_1d0);
      }
      bVar4 = IsKeyword(this,&keyCOMMAND_abi_cxx11_,pcVar13);
      iVar3._M_node = local_1e0._M_node;
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        this_00 = cmMakefile::GetState(this->Makefile);
        pcVar6 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        std::__cxx11::string::string((string *)this_01,pcVar6,(allocator *)&local_1c8);
        pcVar7 = cmState::GetCommand(this_00,(string *)this_01);
        pcVar5 = this_01;
        std::__cxx11::string::~string((string *)this_01);
        HandlePredicate(pcVar5,pcVar7 != (cmCommand *)0x0,&reducible,&arg,newArgs,&local_1e0,
                        &local_1d0);
      }
      bVar4 = IsKeyword(this,&keyPOLICY_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar5 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
        bVar4 = cmPolicies::GetPolicyID((char *)pcVar5,(PolicyID *)this_01);
        HandlePredicate(pcVar5,bVar4,&reducible,&arg,newArgs,&local_1e0,&local_1d0);
      }
      bVar4 = IsKeyword(this,&keyTARGET_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar12 = this->Makefile;
        psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
        pcVar9 = cmMakefile::FindTargetToUse(pcVar12,psVar8,false);
        HandlePredicate((cmConditionEvaluator *)pcVar12,pcVar9 != (cmTarget *)0x0,&reducible,&arg,
                        newArgs,&local_1e0,&local_1d0);
      }
      if (this->Policy64Status < NEW) {
        if (this->Policy64Status == WARN) {
          bVar4 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar13);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x40,id);
            poVar10 = std::operator<<((ostream *)this_01,(string *)&local_1c8);
            std::operator<<(poVar10,"\n");
            std::__cxx11::string::~string((string *)&local_1c8);
            std::operator<<((ostream *)this_01,
                            "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                           );
            pcVar12 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar12,AUTHOR_WARNING,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pid);
          }
        }
      }
      else {
        bVar4 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar13);
        if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
          pcVar12 = this->Makefile;
          pcVar6 = cmExpandedCommandArgument::c_str
                             ((cmExpandedCommandArgument *)(local_1e0._M_node + 1));
          std::__cxx11::string::string((string *)this_01,pcVar6,(allocator *)&local_1c8);
          pcVar11 = cmMakefile::GetTest(pcVar12,(string *)this_01);
          std::__cxx11::string::~string((string *)this_01);
          HandlePredicate(this_01,pcVar11 != (cmTest *)0x0,&reducible,&arg,newArgs,&local_1e0,
                          &local_1d0);
        }
      }
      bVar4 = IsKeyword(this,&keyDEFINED_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e0._M_node != (_List_node_base *)newArgs)) {
        pcVar13 = (cmExpandedCommandArgument *)(local_1e0._M_node + 1);
        psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
        uVar2 = psVar8->_M_string_length;
        if (uVar2 < 5) {
LAB_003f2e8a:
          pcVar12 = this->Makefile;
          psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          bVar4 = cmMakefile::IsDefinitionSet(pcVar12,psVar8);
        }
        else {
          psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          std::__cxx11::string::substr((ulong)&pid,(ulong)psVar8);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&pid,"ENV{");
          if (!bVar4) {
            std::__cxx11::string::~string((string *)&pid);
            goto LAB_003f2e8a;
          }
          psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          cVar1 = (psVar8->_M_dataplus)._M_p[uVar2 - 1];
          std::__cxx11::string::~string((string *)&pid);
          if (cVar1 != '}') goto LAB_003f2e8a;
          psVar8 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          pcVar12 = (cmMakefile *)&pid;
          std::__cxx11::string::substr((ulong)pcVar12,(ulong)psVar8);
          bVar4 = cmsys::SystemTools::HasEnv(_pid);
          std::__cxx11::string::~string((string *)pcVar12);
        }
        HandlePredicate((cmConditionEvaluator *)pcVar12,bVar4,&reducible,&arg,newArgs,&local_1e0,
                        &local_1d0);
      }
      arg._M_node = (arg._M_node)->_M_next;
    }
    if (reducible == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        cmake::MessageType&)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      // does a file exist
      if (this->IsKeyword(keyEXISTS, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileExists(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a directory with this name exist
      if (this->IsKeyword(keyIS_DIRECTORY, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsDirectory(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a symlink with this name exist
      if (this->IsKeyword(keyIS_SYMLINK, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsSymlink(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // is the given path an absolute path ?
      if (this->IsKeyword(keyIS_ABSOLUTE, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsFullPath(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a command exist
      if (this->IsKeyword(keyCOMMAND, *arg) && argP1 != newArgs.end()) {
        cmCommand* command =
          this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(command != CM_NULLPTR, reducible, arg, newArgs,
                              argP1, argP2);
      }
      // does a policy exist
      if (this->IsKeyword(keyPOLICY, *arg) && argP1 != newArgs.end()) {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(cmPolicies::GetPolicyID(argP1->c_str(), pid),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a target exist
      if (this->IsKeyword(keyTARGET, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue()) != CM_NULLPTR,
          reducible, arg, newArgs, argP1, argP2);
      }
      // does a test exist
      if (this->Policy64Status != cmPolicies::OLD &&
          this->Policy64Status != cmPolicies::WARN) {
        if (this->IsKeyword(keyTEST, *arg) && argP1 != newArgs.end()) {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(haveTest != CM_NULLPTR, reducible, arg,
                                newArgs, argP1, argP2);
        }
      } else if (this->Policy64Status == cmPolicies::WARN &&
                 this->IsKeyword(keyTEST, *arg)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      // is a variable defined
      if (this->IsKeyword(keyDEFINED, *arg) && argP1 != newArgs.end()) {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if (argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
            argP1->GetValue().operator[](argP1len - 1) == '}') {
          std::string env = argP1->GetValue().substr(4, argP1len - 5);
          bdef = cmSystemTools::HasEnv(env.c_str());
        } else {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
        }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}